

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::internalCompile(SelectionCompiler *this)

{
  undefined4 uVar1;
  pointer pvVar2;
  iterator iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  TokenMap *this_00;
  Token *pTVar8;
  char cVar9;
  uint uVar10;
  pointer this_01;
  byte bVar11;
  pointer pvVar12;
  float fVar13;
  string str;
  Token token;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> ltoken;
  Token tokenCommand;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [8];
  float fStack_e0;
  undefined4 uStack_dc;
  _Storage _Stack_d8;
  code *local_d0;
  _Storage local_c8;
  undefined8 local_c0;
  any *local_b8;
  _Storage local_b0;
  string *local_a8;
  float local_9c;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> local_98;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 local_64;
  vector<int,std::allocator<int>> *local_60;
  int *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *local_48;
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  *local_40;
  _Storage *local_38;
  
  this->cchScript = (int)(this->script)._M_string_length;
  this->ichToken = 0;
  this->lineCurrent = 1;
  this->error = false;
  pvVar12 = (this->aatokenCompiled).
            super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->aatokenCompiled).
           super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = pvVar12;
  if (pvVar2 != pvVar12) {
    do {
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pvVar2);
    (this->aatokenCompiled).
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar12;
  }
  local_a8 = &this->script;
  local_40 = &this->aatokenCompiled;
  local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = 5;
  local_74 = 0;
  uStack_70 = 0;
  uStack_6c = 0;
  uStack_68 = 0;
  local_64 = 0;
  local_58 = &this->ichCurrentCommand;
  local_48 = &this->atokenCommand;
  local_50 = &this->lineNumbers;
  local_60 = (vector<int,std::allocator<int>> *)&this->lineIndices;
  uVar10 = 0;
  do {
    bVar6 = lookingAtLeadingWhitespace(this);
    if (!bVar6) {
      bVar6 = lookingAtEndOfLine(this);
      if (bVar6) {
LAB_00264069:
        if (uVar10 == 0) {
LAB_002642ab:
          bVar7 = this->ichToken < this->cchScript;
          uVar10 = 0;
          if (bVar6 && bVar7) {
            this->lineCurrent = this->lineCurrent + 1;
            goto LAB_002644ca;
          }
          cVar9 = bVar7 * '\x02' + '\x02';
        }
        else {
          bVar7 = compileCommand(this,&local_98);
          if (bVar7) {
            std::
            vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
            ::push_back(local_40,local_48);
            local_108._0_4_ = (int)this->lineCurrent;
            iVar3._M_current =
                 (this->lineNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->lineNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_50,iVar3,(int *)local_108);
            }
            else {
              *iVar3._M_current = (int)this->lineCurrent;
              (this->lineNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            iVar3._M_current =
                 (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_60,iVar3,local_58);
            }
            else {
              *iVar3._M_current = this->ichCurrentCommand;
              (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::_M_erase_at_end
                      (&local_98,
                       local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start);
            goto LAB_002642ab;
          }
          cVar9 = '\x01';
          pvVar12 = (pointer)0x0;
        }
      }
      else {
        if ((this->ichToken != this->cchScript) &&
           ((local_a8->_M_dataplus)._M_p[this->ichToken] == ';')) {
          this->cchToken = 1;
          goto LAB_00264069;
        }
        if (uVar10 == 0) {
LAB_002643c1:
          bVar6 = lookingAtLookupToken(this);
          if (bVar6) {
            std::__cxx11::string::substr((ulong)local_108,(ulong)local_a8);
            local_e8._0_4_ = 5;
            local_e8._4_4_ = 0;
            fStack_e0 = 0.0;
            uStack_dc = 0;
            _Stack_d8._0_4_ = 0;
            _Stack_d8._4_4_ = 0;
            this_00 = TokenMap::getInstance();
            pTVar8 = TokenMap::getToken(this_00,(string *)local_108);
            if (pTVar8 == (Token *)0x0) {
              local_b8 = (any *)std::any::
                                _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::_S_manage;
              local_b0._M_ptr = (void *)0x0;
              std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                        (&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
              local_d0 = (code *)0x1;
              local_c0 = 0;
              if (local_b8 == (any *)0x0) {
                local_c8._M_ptr = (code *)0x0;
              }
              else {
                local_38 = &local_c8;
                (*(code *)local_b8)(2,&local_b8,&local_38);
              }
              local_e8._0_4_ = SUB84(local_d0,0);
              local_e8._4_4_ = (undefined4)((ulong)local_d0 >> 0x20);
              std::any::operator=((any *)&fStack_e0,(any *)&local_c8);
              if ((code *)local_c8._M_ptr != (code *)0x0) {
                (*(code *)local_c8)(3,&local_c8,0);
                local_c8._M_ptr = (code *)0x0;
              }
              if (local_b8 != (any *)0x0) {
                (*(code *)local_b8)(3,&local_b8,0);
                local_b8 = (any *)0x0;
              }
            }
            else {
              uVar1 = pTVar8->tok;
              uVar4 = pTVar8->intValue;
              local_e8._0_4_ = uVar1;
              local_e8._4_4_ = uVar4;
              std::any::operator=((any *)&fStack_e0,&pTVar8->value);
            }
            uVar5 = local_e8._0_4_;
            if (uVar10 == 0x302) {
              uVar10 = 0x302;
              if (((uint)local_e8._0_4_ >> 10 & 1) != 0 || local_e8._0_4_ == 1) goto LAB_002646a3;
              bVar6 = invalidExpressionToken(this,(string *)local_108);
              uVar10 = 0x302;
LAB_00264698:
              pvVar12 = (pointer)(ulong)bVar6;
              cVar9 = '\x01';
            }
            else if (uVar10 == 0x301) {
              if ((long)local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start == 0x18) {
                uVar10 = 0x301;
                if ((local_e8._0_4_ & 0x4400) != 0x4400 && local_e8._0_4_ != 1) {
LAB_00264684:
                  bVar6 = invalidExpressionToken(this,(string *)local_108);
                  uVar10 = 0x301;
                  goto LAB_00264698;
                }
              }
              else {
                uVar10 = 0x301;
                if ((local_e8._0_4_ & 0x4400) == 0 && local_e8._0_4_ != 1) goto LAB_00264684;
              }
LAB_002646a3:
              cVar9 = '\x04';
              std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                        (&local_98,(value_type *)local_e8);
            }
            else {
              if ((uVar10 != 0) ||
                 (this->ichCurrentCommand = this->ichToken, uVar10 = local_e8._0_4_,
                 ((uint)local_e8._0_4_ >> 8 & 1) != 0)) goto LAB_002646a3;
              bVar6 = commandExpected(this);
              pvVar12 = (pointer)(ulong)bVar6;
              cVar9 = '\x01';
              uVar10 = uVar5;
            }
            if ((code *)CONCAT44(uStack_dc,fStack_e0) != (code *)0x0) {
              (*(code *)CONCAT44(uStack_dc,fStack_e0))(3,&fStack_e0,0);
              fStack_e0 = 0.0;
              uStack_dc = 0;
            }
            if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
              operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
            }
          }
          else {
            if (local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              bVar6 = commandExpected(this);
            }
            else {
              bVar6 = unrecognizedToken(this);
            }
            pvVar12 = (pointer)(ulong)bVar6;
            cVar9 = '\x01';
          }
          goto LAB_002644d0;
        }
        bVar6 = lookingAtString(this);
        if (bVar6) {
          getUnescapedStringLiteral_abi_cxx11_((string *)local_108,this);
          local_d0 = std::any::
                     _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::_S_manage;
          local_c8._M_ptr = (code *)0x0;
          std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                    (&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
          ;
          local_e8._0_4_ = 4;
          local_e8._4_4_ = 0;
          _Stack_d8._0_4_ = 0;
          _Stack_d8._4_4_ = 0;
          if (local_d0 == (code *)0x0) {
            fStack_e0 = 0.0;
            uStack_dc = 0;
          }
          else {
            local_b8 = (any *)&fStack_e0;
            (*local_d0)(2,&local_d0,&local_b8);
          }
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::emplace_back<OpenMD::Token>
                    (&local_98,(Token *)local_e8);
          if ((code *)CONCAT44(uStack_dc,fStack_e0) != (code *)0x0) {
            (*(code *)CONCAT44(uStack_dc,fStack_e0))(3,&fStack_e0,0);
            fStack_e0 = 0.0;
            uStack_dc = 0;
          }
          if (local_d0 != (code *)0x0) {
            (*local_d0)(3,&local_d0,0);
            local_d0 = (code *)0x0;
          }
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
          }
        }
        else {
          bVar6 = lookingAtDecimal(this,false);
          if (bVar6) {
            std::__cxx11::string::substr((ulong)local_108,(ulong)local_a8);
            fVar13 = lexi_cast<float>((string *)local_108);
            if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
              local_9c = fVar13;
              operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
              fVar13 = local_9c;
            }
            local_e8._0_4_ = 0x22004a;
            local_e8._4_4_ = 0;
            uStack_dc = 0;
            local_108._0_8_ = (pointer)0x3;
            local_f8._M_allocated_capacity._4_4_ = 0;
            local_f8._M_allocated_capacity._0_4_ = fVar13;
            local_108._8_8_ = std::any::_Manager_internal<float>::_S_manage;
            fStack_e0 = fVar13;
            std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::emplace_back<OpenMD::Token>
                      (&local_98,(Token *)local_108);
            if ((_func_void__Op_any_ptr__Arg_ptr *)local_108._8_8_ !=
                (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
              (*(code *)local_108._8_8_)(_Op_destroy,(any *)(local_108 + 8),(_Arg *)0x0);
              local_108._8_8_ = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
            }
            if ((code *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != (code *)0x0) {
              (*(code *)CONCAT44(local_e8._4_4_,local_e8._0_4_))(3,local_e8,0);
LAB_002643b3:
              local_e8._0_4_ = 0;
              local_e8._4_4_ = 0;
            }
          }
          else {
            bVar6 = lookingAtInteger(this,true);
            if (!bVar6) goto LAB_002643c1;
            std::__cxx11::string::substr((ulong)local_108,(ulong)local_a8);
            fVar13 = (float)lexi_cast<int>((string *)local_108);
            if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
              operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
            }
            local_e8._0_4_ = 0x2200f0;
            local_e8._4_4_ = 0;
            uStack_dc = 0;
            local_108._0_8_ = (pointer)0x2;
            local_f8._M_allocated_capacity._4_4_ = 0;
            local_f8._M_allocated_capacity._0_4_ = fVar13;
            local_108._8_8_ = std::any::_Manager_internal<int>::_S_manage;
            fStack_e0 = fVar13;
            std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::emplace_back<OpenMD::Token>
                      (&local_98,(Token *)local_108);
            if ((_func_void__Op_any_ptr__Arg_ptr *)local_108._8_8_ !=
                (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
              (*(code *)local_108._8_8_)(_Op_destroy,(any *)(local_108 + 8),(_Arg *)0x0);
              local_108._8_8_ = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
            }
            if ((code *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != (code *)0x0) {
              (*(code *)CONCAT44(local_e8._4_4_,local_e8._0_4_))(3,local_e8,0);
              goto LAB_002643b3;
            }
          }
        }
LAB_002644ca:
        cVar9 = '\x04';
      }
LAB_002644d0:
      bVar11 = (byte)pvVar12;
      if (cVar9 != '\x04') {
        if (cVar9 == '\x02') {
          bVar11 = 1;
        }
        if ((code *)CONCAT44(uStack_6c,uStack_70) != (code *)0x0) {
          (*(code *)CONCAT44(uStack_6c,uStack_70))(3,&uStack_70,0);
          uStack_70 = 0;
          uStack_6c = 0;
        }
        std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector(&local_98);
        return (bool)(bVar11 & 1);
      }
    }
    this->ichToken = this->ichToken + this->cchToken;
  } while( true );
}

Assistant:

bool SelectionCompiler::internalCompile() {
    cchScript   = script.size();
    ichToken    = 0;
    lineCurrent = 1;

    error = false;

    // std::vector<Token> lltoken;
    aatokenCompiled.clear();
    std::vector<Token> ltoken;

    Token tokenCommand;
    int tokCommand = Token::nada;

    for (; true; ichToken += cchToken) {
      if (lookingAtLeadingWhitespace()) continue;
      // if (lookingAtComment())
      //    continue;
      bool endOfLine = lookingAtEndOfLine();
      if (endOfLine || lookingAtEndOfStatement()) {
        if (tokCommand != Token::nada) {
          if (!compileCommand(ltoken)) { return false; }
          aatokenCompiled.push_back(atokenCommand);
          lineNumbers.push_back(lineCurrent);
          lineIndices.push_back(ichCurrentCommand);
          ltoken.clear();
          tokCommand = Token::nada;
        }

        if (ichToken < cchScript) {
          if (endOfLine) ++lineCurrent;
          continue;
        }
        break;
      }

      if (tokCommand != Token::nada) {
        if (lookingAtString()) {
          std::string str = getUnescapedStringLiteral();
          ltoken.push_back(Token(Token::string, str));
          continue;
        }
        // if ((tokCommand & Token::specialstring) != 0 &&
        //    lookingAtSpecialString()) {
        //    std::string str = script.substr(ichToken, ichToken + cchToken);
        //    ltoken.push_back(Token(Token::string, str));
        //    continue;
        //}
        // if (lookingAtDecimal((tokCommand & Token::negnums) != 0)) {
        if (lookingAtDecimal((tokCommand) != 0)) {
          float value = lexi_cast<float>(script.substr(ichToken, cchToken));
          ltoken.push_back(Token(Token::decimal, std::any(value)));
          continue;
        }
        // if (lookingAtInteger((tokCommand & Token::negnums) != 0)) {
        if (lookingAtInteger((tokCommand) != 0)) {
          int val = lexi_cast<int>(script.substr(ichToken, cchToken));
          ltoken.push_back(Token(Token::integer, std::any(val)));
          continue;
        }
      }

      if (lookingAtLookupToken()) {
        std::string ident = script.substr(ichToken, cchToken);
        Token token;
        Token* pToken = TokenMap::getInstance().getToken(ident);
        if (pToken != NULL) {
          token = *pToken;
        } else {
          token = Token(Token::identifier, ident);
        }

        int tok = token.tok;

        switch (tokCommand) {
        case Token::nada:
          ichCurrentCommand = ichToken;
          // tokenCommand = token;
          tokCommand = tok;
          if ((tokCommand & Token::command) == 0) return commandExpected();
          break;

        case Token::define:
          if (ltoken.size() == 1) {
            // we are looking at the variable name
            if (tok != Token::identifier &&
                (tok & Token::predefinedset) != Token::predefinedset)
              return invalidExpressionToken(ident);
          } else {
            // we are looking at the expression
            if (tok != Token::identifier &&
                (tok & (Token::expression | Token::predefinedset)) == 0)
              return invalidExpressionToken(ident);
          }

          break;

        case Token::select:
          if (tok != Token::identifier && (tok & Token::expression) == 0)
            return invalidExpressionToken(ident);
          break;
        }
        ltoken.push_back(token);
        continue;
      }

      if (ltoken.empty()) { return commandExpected(); }

      return unrecognizedToken();
    }

    return true;
  }